

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar.c
# Opt level: O3

axbStatus_t axbScalarDestroy(axbScalar_s *scalar)

{
  axbStatus_t aVar1;
  
  aVar1 = 0xdad1b;
  if (scalar->init == 0xdad1b) {
    scalar->init = 0xdad1c;
    aVar1 = 0;
    (*scalar->memBackend->op_free)(scalar->data,(void *)0x0);
    free(scalar->name);
    free(scalar);
  }
  return aVar1;
}

Assistant:

axbStatus_t axbScalarDestroy(struct axbScalar_s *scalar)
{
  if (scalar->init != 896283) return 896283;
  scalar->init += 1;

  scalar->memBackend->op_free(scalar->data, NULL);
  free(scalar->name);
  free(scalar);
  return 0;
}